

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reldtfmt.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::RelativeDateFormat::format
          (RelativeDateFormat *this,Calendar *cal,UnicodeString *appendTo,FieldPosition *pos)

{
  char cVar1;
  URelativeString *pUVar2;
  UBool UVar3;
  uint uVar4;
  int32_t iVar5;
  UChar32 c;
  undefined4 uVar6;
  int32_t srcLength;
  uint uVar7;
  UnicodeString *this_00;
  UChar *srcChars;
  UErrorCode status;
  Calendar *local_170;
  FieldPosition *local_168;
  ConstChar16Ptr local_160;
  ConstChar16Ptr local_158;
  UnicodeString relativeDayString;
  UnicodeString combinedPattern;
  UnicodeString datePattern;
  UnicodeString local_70;
  
  status = U_ZERO_ERROR;
  relativeDayString.super_Replaceable.super_UObject._vptr_UObject =
       (UObject)&PTR__UnicodeString_0048be70;
  relativeDayString.fUnion.fStackFields.fLengthAndFlags = 2;
  local_168 = pos;
  uVar4 = (*(this->super_DateFormat).super_Format.super_UObject._vptr_UObject[0x1a])(this,1);
  local_170 = cal;
  iVar5 = dayDifference(cal,&status);
  if ((status < U_ILLEGAL_ARGUMENT_ERROR) && (srcLength = 0, -3 < iVar5)) {
    uVar7 = iVar5 + 2;
    srcChars = (UChar *)0x0;
    if ((int)uVar7 < this->fDatesLen) {
      pUVar2 = this->fDates;
      if ((pUVar2[uVar7].offset != iVar5) || (pUVar2[uVar7].string == (UChar *)0x0))
      goto LAB_002ff26c;
      srcLength = pUVar2[uVar7].len;
      srcChars = pUVar2[uVar7].string;
    }
  }
  else {
LAB_002ff26c:
    srcLength = 0;
    srcChars = (UChar *)0x0;
  }
  if ((status < U_ILLEGAL_ARGUMENT_ERROR) && (srcChars != (UChar *)0x0)) {
    icu_63::UnicodeString::unBogus(&relativeDayString);
    uVar6 = relativeDayString.fUnion.fFields.fLength;
    if (-1 < relativeDayString.fUnion.fStackFields.fLengthAndFlags) {
      uVar6 = (int)relativeDayString.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    icu_63::UnicodeString::doReplace(&relativeDayString,0,uVar6,srcChars,0,srcLength);
  }
  uVar6 = relativeDayString.fUnion.fFields.fLength;
  if (-1 < relativeDayString.fUnion.fStackFields.fLengthAndFlags) {
    uVar6 = (int)relativeDayString.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  uVar7 = uVar4;
  if (((0 < (int)uVar6) && (0x1f < (ushort)(this->fDatePattern).fUnion.fStackFields.fLengthAndFlags)
      ) && (((ushort)(this->fTimePattern).fUnion.fStackFields.fLengthAndFlags < 0x20 ||
            ((this->fCombinedFormat == (SimpleFormatter *)0x0 ||
             (this->fCombinedHasDateAtStart != '\0')))))) {
    c = icu_63::UnicodeString::char32At(&relativeDayString,0);
    UVar3 = u_islower_63(c);
    uVar7 = 0x100;
    if ((UVar3 != '\0') && (this->fCapitalizationBrkIter != (BreakIterator *)0x0)) {
      if (uVar4 != 0x102) {
        if (uVar4 == 0x104) {
          cVar1 = this->fCapitalizationOfRelativeUnitsForStandAlone;
        }
        else {
          if (uVar4 != 0x103) goto LAB_002ff3ba;
          cVar1 = this->fCapitalizationOfRelativeUnitsForUIListMenu;
        }
        if (cVar1 == '\0') goto LAB_002ff3ba;
      }
      icu_63::UnicodeString::toTitle
                (&relativeDayString,this->fCapitalizationBrkIter,&this->fLocale,0x300);
    }
  }
LAB_002ff3ba:
  (*(this->fDateTimeFormatter->super_DateFormat).super_Format.super_UObject._vptr_UObject[0x19])
            (this->fDateTimeFormatter,(ulong)uVar7,&status);
  if ((ushort)(this->fDatePattern).fUnion.fStackFields.fLengthAndFlags < 0x20) {
    (*(this->fDateTimeFormatter->super_DateFormat).super_Format.super_UObject._vptr_UObject[0x20])
              (this->fDateTimeFormatter,&this->fTimePattern);
  }
  else {
    this_00 = &this->fDatePattern;
    if ((0x1f < (ushort)(this->fTimePattern).fUnion.fStackFields.fLengthAndFlags) &&
       (this->fCombinedFormat != (SimpleFormatter *)0x0)) {
      datePattern.super_Replaceable.super_UObject._vptr_UObject =
           (UObject)&PTR__UnicodeString_0048be70;
      datePattern.fUnion.fStackFields.fLengthAndFlags = 2;
      uVar6 = relativeDayString.fUnion.fFields.fLength;
      if (-1 < relativeDayString.fUnion.fStackFields.fLengthAndFlags) {
        uVar6 = (int)relativeDayString.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      if (0 < (int)uVar6) {
        local_158.p_ = L"\'";
        icu_63::UnicodeString::UnicodeString(&combinedPattern,'\x01',&local_158,1);
        local_160.p_ = L"\'\'";
        icu_63::UnicodeString::UnicodeString(&local_70,'\x01',&local_160,2);
        if (-1 < relativeDayString.fUnion.fStackFields.fLengthAndFlags) {
          relativeDayString.fUnion.fFields.fLength =
               (int)relativeDayString.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        if (-1 < combinedPattern.fUnion.fStackFields.fLengthAndFlags) {
          combinedPattern.fUnion.fFields.fLength =
               (int)combinedPattern.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
          local_70.fUnion.fFields.fLength = (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        icu_63::UnicodeString::findAndReplace
                  (&relativeDayString,0,relativeDayString.fUnion.fFields.fLength,&combinedPattern,0,
                   combinedPattern.fUnion.fFields.fLength,&local_70,0,
                   local_70.fUnion.fFields.fLength);
        icu_63::UnicodeString::~UnicodeString(&local_70);
        icu_63::UnicodeString::~UnicodeString(&combinedPattern);
        combinedPattern.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x27;
        icu_63::UnicodeString::doReplace(&relativeDayString,0,0,(UChar *)&combinedPattern,0,1);
        combinedPattern.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x27;
        this_00 = &relativeDayString;
        icu_63::UnicodeString::doAppend(this_00,(UChar *)&combinedPattern,0,1);
      }
      icu_63::UnicodeString::copyFrom(&datePattern,this_00,'\0');
      combinedPattern.super_Replaceable.super_UObject._vptr_UObject =
           (UObject)&PTR__UnicodeString_0048be70;
      combinedPattern.fUnion.fStackFields.fLengthAndFlags = 2;
      SimpleFormatter::format
                (this->fCombinedFormat,&this->fTimePattern,&datePattern,&combinedPattern,&status);
      (*(this->fDateTimeFormatter->super_DateFormat).super_Format.super_UObject._vptr_UObject[0x20])
                (this->fDateTimeFormatter,&combinedPattern);
      (*(this->fDateTimeFormatter->super_DateFormat).super_Format.super_UObject._vptr_UObject[8])
                (this->fDateTimeFormatter,local_170,appendTo,local_168);
      icu_63::UnicodeString::~UnicodeString(&combinedPattern);
      icu_63::UnicodeString::~UnicodeString(&datePattern);
      goto LAB_002ff49c;
    }
    if (-1 < relativeDayString.fUnion.fStackFields.fLengthAndFlags) {
      relativeDayString.fUnion.fFields.fLength =
           (int)relativeDayString.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    if (0 < relativeDayString.fUnion.fFields.fLength) {
      icu_63::UnicodeString::doAppend
                (appendTo,&relativeDayString,0,relativeDayString.fUnion.fFields.fLength);
      goto LAB_002ff49c;
    }
    (*(this->fDateTimeFormatter->super_DateFormat).super_Format.super_UObject._vptr_UObject[0x20])
              (this->fDateTimeFormatter,this_00);
  }
  (*(this->fDateTimeFormatter->super_DateFormat).super_Format.super_UObject._vptr_UObject[8])
            (this->fDateTimeFormatter,local_170,appendTo,local_168);
LAB_002ff49c:
  icu_63::UnicodeString::~UnicodeString(&relativeDayString);
  return appendTo;
}

Assistant:

UnicodeString& RelativeDateFormat::format(  Calendar& cal,
                                UnicodeString& appendTo,
                                FieldPosition& pos) const {
                                
    UErrorCode status = U_ZERO_ERROR;
    UnicodeString relativeDayString;
    UDisplayContext capitalizationContext = getContext(UDISPCTX_TYPE_CAPITALIZATION, status);
    
    // calculate the difference, in days, between 'cal' and now.
    int dayDiff = dayDifference(cal, status);

    // look up string
    int32_t len = 0;
    const UChar *theString = getStringForDay(dayDiff, len, status);
    if(U_SUCCESS(status) && (theString!=NULL)) {
        // found a relative string
        relativeDayString.setTo(theString, len);
    }

    if ( relativeDayString.length() > 0 && !fDatePattern.isEmpty() && 
         (fTimePattern.isEmpty() || fCombinedFormat == NULL || fCombinedHasDateAtStart)) {
#if !UCONFIG_NO_BREAK_ITERATION
        // capitalize relativeDayString according to context for relative, set formatter no context
        if ( u_islower(relativeDayString.char32At(0)) && fCapitalizationBrkIter!= NULL &&
             ( capitalizationContext==UDISPCTX_CAPITALIZATION_FOR_BEGINNING_OF_SENTENCE ||
               (capitalizationContext==UDISPCTX_CAPITALIZATION_FOR_UI_LIST_OR_MENU && fCapitalizationOfRelativeUnitsForUIListMenu) ||
               (capitalizationContext==UDISPCTX_CAPITALIZATION_FOR_STANDALONE && fCapitalizationOfRelativeUnitsForStandAlone) ) ) {
            // titlecase first word of relativeDayString
            relativeDayString.toTitle(fCapitalizationBrkIter, fLocale, U_TITLECASE_NO_LOWERCASE | U_TITLECASE_NO_BREAK_ADJUSTMENT);
        }
#endif
        fDateTimeFormatter->setContext(UDISPCTX_CAPITALIZATION_NONE, status);
    } else {
        // set our context for the formatter
        fDateTimeFormatter->setContext(capitalizationContext, status);
    }

    if (fDatePattern.isEmpty()) {
        fDateTimeFormatter->applyPattern(fTimePattern);
        fDateTimeFormatter->format(cal,appendTo,pos);
    } else if (fTimePattern.isEmpty() || fCombinedFormat == NULL) {
        if (relativeDayString.length() > 0) {
            appendTo.append(relativeDayString);
        } else {
            fDateTimeFormatter->applyPattern(fDatePattern);
            fDateTimeFormatter->format(cal,appendTo,pos);
        }
    } else {
        UnicodeString datePattern;
        if (relativeDayString.length() > 0) {
            // Need to quote the relativeDayString to make it a legal date pattern
            relativeDayString.findAndReplace(UNICODE_STRING("'", 1), UNICODE_STRING("''", 2)); // double any existing APOSTROPHE
            relativeDayString.insert(0, APOSTROPHE); // add APOSTROPHE at beginning...
            relativeDayString.append(APOSTROPHE); // and at end
            datePattern.setTo(relativeDayString);
        } else {
            datePattern.setTo(fDatePattern);
        }
        UnicodeString combinedPattern;
        fCombinedFormat->format(fTimePattern, datePattern, combinedPattern, status);
        fDateTimeFormatter->applyPattern(combinedPattern);
        fDateTimeFormatter->format(cal,appendTo,pos);
    }

    return appendTo;
}